

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<4,_8,_16777232,_false,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::ObjectIntersectorK<8,_true>_>,_false>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  undefined1 (*pauVar1) [32];
  undefined4 uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  undefined8 uVar9;
  ulong uVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  AABBNodeMB4D *node1;
  RTCIntersectFunctionN p_Var21;
  byte bVar22;
  long lVar23;
  byte bVar24;
  ulong uVar25;
  ulong uVar26;
  undefined1 (*pauVar27) [32];
  uint uVar28;
  ulong *puVar29;
  bool bVar30;
  byte bVar31;
  ulong uVar32;
  ulong uVar33;
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  vint<8> mask;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  byte local_27b0;
  RTCIntersectFunctionNArguments local_2788;
  Geometry *local_2758;
  undefined8 local_2750;
  RTCIntersectArguments *local_2748;
  undefined1 local_2740 [32];
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined8 local_2610;
  ulong local_2608 [241];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  
  uVar25 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (uVar25 != 8) {
    auVar37 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
    uVar32 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(ZEXT816(0) << 0x40),5);
    uVar26 = vpcmpeqd_avx512vl(auVar37,(undefined1  [32])valid_i->field_0);
    uVar32 = uVar32 & uVar26;
    bVar31 = (byte)uVar32;
    if (bVar31 != 0) {
      auVar37 = *(undefined1 (*) [32])(ray + 0x80);
      auVar35 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar36 = *(undefined1 (*) [32])(ray + 0xc0);
      local_1e80._8_4_ = 0x7f800000;
      local_1e80._0_8_ = 0x7f8000007f800000;
      local_1e80._12_4_ = 0x7f800000;
      local_1e80._16_4_ = 0x7f800000;
      local_1e80._20_4_ = 0x7f800000;
      local_1e80._24_4_ = 0x7f800000;
      local_1e80._28_4_ = 0x7f800000;
      auVar57 = ZEXT3264(local_1e80);
      auVar34 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),ZEXT1632(ZEXT816(0) << 0x40));
      local_26e0._0_4_ = (uint)(bVar31 & 1) * auVar34._0_4_ | (uint)!(bool)(bVar31 & 1) * 0x7f800000
      ;
      bVar30 = (bool)((byte)(uVar32 >> 1) & 1);
      local_26e0._4_4_ = (uint)bVar30 * auVar34._4_4_ | (uint)!bVar30 * 0x7f800000;
      bVar30 = (bool)((byte)(uVar32 >> 2) & 1);
      local_26e0._8_4_ = (uint)bVar30 * auVar34._8_4_ | (uint)!bVar30 * 0x7f800000;
      bVar30 = (bool)((byte)(uVar32 >> 3) & 1);
      local_26e0._12_4_ = (uint)bVar30 * auVar34._12_4_ | (uint)!bVar30 * 0x7f800000;
      bVar30 = (bool)((byte)(uVar32 >> 4) & 1);
      local_26e0._16_4_ = (uint)bVar30 * auVar34._16_4_ | (uint)!bVar30 * 0x7f800000;
      bVar30 = (bool)((byte)(uVar32 >> 5) & 1);
      local_26e0._20_4_ = (uint)bVar30 * auVar34._20_4_ | (uint)!bVar30 * 0x7f800000;
      bVar30 = (bool)((byte)(uVar32 >> 6) & 1);
      local_26e0._24_4_ = (uint)bVar30 * auVar34._24_4_ | (uint)!bVar30 * 0x7f800000;
      bVar30 = SUB81(uVar32 >> 7,0);
      local_26e0._28_4_ = (uint)bVar30 * auVar34._28_4_ | (uint)!bVar30 * 0x7f800000;
      auVar58 = ZEXT3264(local_26e0);
      auVar34 = *(undefined1 (*) [32])ray;
      auVar38._0_8_ = auVar34._0_8_ ^ 0x8000000080000000;
      auVar38._8_4_ = auVar34._8_4_ ^ 0x80000000;
      auVar38._12_4_ = auVar34._12_4_ ^ 0x80000000;
      auVar38._16_4_ = auVar34._16_4_ ^ 0x80000000;
      auVar38._20_4_ = auVar34._20_4_ ^ 0x80000000;
      auVar38._24_4_ = auVar34._24_4_ ^ 0x80000000;
      auVar38._28_4_ = auVar34._28_4_ ^ 0x80000000;
      local_27b0 = ~bVar31;
      auVar34 = *(undefined1 (*) [32])(ray + 0x20);
      auVar39._0_8_ = auVar34._0_8_ ^ 0x8000000080000000;
      auVar39._8_4_ = auVar34._8_4_ ^ 0x80000000;
      auVar39._12_4_ = auVar34._12_4_ ^ 0x80000000;
      auVar39._16_4_ = auVar34._16_4_ ^ 0x80000000;
      auVar39._20_4_ = auVar34._20_4_ ^ 0x80000000;
      auVar39._24_4_ = auVar34._24_4_ ^ 0x80000000;
      auVar39._28_4_ = auVar34._28_4_ ^ 0x80000000;
      auVar34 = *(undefined1 (*) [32])(ray + 0x40);
      auVar40._0_8_ = auVar34._0_8_ ^ 0x8000000080000000;
      auVar40._8_4_ = auVar34._8_4_ ^ 0x80000000;
      auVar40._12_4_ = auVar34._12_4_ ^ 0x80000000;
      auVar40._16_4_ = auVar34._16_4_ ^ 0x80000000;
      auVar40._20_4_ = auVar34._20_4_ ^ 0x80000000;
      auVar40._24_4_ = auVar34._24_4_ ^ 0x80000000;
      auVar40._28_4_ = auVar34._28_4_ ^ 0x80000000;
      local_2610 = 0xfffffffffffffff8;
      local_2608[0] = uVar25;
      local_1e60 = local_26e0;
      if (uVar25 != 0xfffffffffffffff8) {
        auVar42._8_4_ = 0x7fffffff;
        auVar42._0_8_ = 0x7fffffff7fffffff;
        auVar42._12_4_ = 0x7fffffff;
        auVar42._16_4_ = 0x7fffffff;
        auVar42._20_4_ = 0x7fffffff;
        auVar42._24_4_ = 0x7fffffff;
        auVar42._28_4_ = 0x7fffffff;
        auVar34 = vandps_avx(auVar37,auVar42);
        auVar44._8_4_ = 0x219392ef;
        auVar44._0_8_ = 0x219392ef219392ef;
        auVar44._12_4_ = 0x219392ef;
        auVar44._16_4_ = 0x219392ef;
        auVar44._20_4_ = 0x219392ef;
        auVar44._24_4_ = 0x219392ef;
        auVar44._28_4_ = 0x219392ef;
        uVar26 = vcmpps_avx512vl(auVar34,auVar44,1);
        bVar30 = (bool)((byte)uVar26 & 1);
        auVar34._0_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar37._0_4_;
        bVar30 = (bool)((byte)(uVar26 >> 1) & 1);
        auVar34._4_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar37._4_4_;
        bVar30 = (bool)((byte)(uVar26 >> 2) & 1);
        auVar34._8_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar37._8_4_;
        bVar30 = (bool)((byte)(uVar26 >> 3) & 1);
        auVar34._12_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar37._12_4_;
        bVar30 = (bool)((byte)(uVar26 >> 4) & 1);
        auVar34._16_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar37._16_4_;
        bVar30 = (bool)((byte)(uVar26 >> 5) & 1);
        auVar34._20_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar37._20_4_;
        bVar30 = (bool)((byte)(uVar26 >> 6) & 1);
        auVar34._24_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar37._24_4_;
        bVar30 = SUB81(uVar26 >> 7,0);
        auVar34._28_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar37._28_4_;
        auVar37 = vandps_avx(auVar35,auVar42);
        uVar26 = vcmpps_avx512vl(auVar37,auVar44,1);
        bVar30 = (bool)((byte)uVar26 & 1);
        auVar41._0_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar35._0_4_;
        bVar30 = (bool)((byte)(uVar26 >> 1) & 1);
        auVar41._4_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar35._4_4_;
        bVar30 = (bool)((byte)(uVar26 >> 2) & 1);
        auVar41._8_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar35._8_4_;
        bVar30 = (bool)((byte)(uVar26 >> 3) & 1);
        auVar41._12_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar35._12_4_;
        bVar30 = (bool)((byte)(uVar26 >> 4) & 1);
        auVar41._16_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar35._16_4_;
        bVar30 = (bool)((byte)(uVar26 >> 5) & 1);
        auVar41._20_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar35._20_4_;
        bVar30 = (bool)((byte)(uVar26 >> 6) & 1);
        auVar41._24_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar35._24_4_;
        bVar30 = SUB81(uVar26 >> 7,0);
        auVar41._28_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar35._28_4_;
        auVar37 = vandps_avx(auVar36,auVar42);
        uVar26 = vcmpps_avx512vl(auVar37,auVar44,1);
        bVar30 = (bool)((byte)uVar26 & 1);
        auVar37._0_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar36._0_4_;
        bVar30 = (bool)((byte)(uVar26 >> 1) & 1);
        auVar37._4_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar36._4_4_;
        bVar30 = (bool)((byte)(uVar26 >> 2) & 1);
        auVar37._8_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar36._8_4_;
        bVar30 = (bool)((byte)(uVar26 >> 3) & 1);
        auVar37._12_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar36._12_4_;
        bVar30 = (bool)((byte)(uVar26 >> 4) & 1);
        auVar37._16_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar36._16_4_;
        bVar30 = (bool)((byte)(uVar26 >> 5) & 1);
        auVar37._20_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar36._20_4_;
        bVar30 = (bool)((byte)(uVar26 >> 6) & 1);
        auVar37._24_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar36._24_4_;
        bVar30 = SUB81(uVar26 >> 7,0);
        auVar37._28_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar36._28_4_;
        auVar35 = vrcp14ps_avx512vl(auVar34);
        auVar43._8_4_ = 0x3f800000;
        auVar43._0_8_ = 0x3f8000003f800000;
        auVar43._12_4_ = 0x3f800000;
        auVar43._16_4_ = 0x3f800000;
        auVar43._20_4_ = 0x3f800000;
        auVar43._24_4_ = 0x3f800000;
        auVar43._28_4_ = 0x3f800000;
        auVar12 = vfnmadd213ps_fma(auVar34,auVar35,auVar43);
        auVar36 = vrcp14ps_avx512vl(auVar41);
        auVar13 = vfnmadd213ps_fma(auVar41,auVar36,auVar43);
        auVar34 = vrcp14ps_avx512vl(auVar37);
        auVar14 = vfnmadd213ps_fma(auVar37,auVar34,auVar43);
        auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar36,auVar36);
        auVar55 = ZEXT1664(auVar13);
        auVar12 = vfmadd132ps_fma(ZEXT1632(auVar12),auVar35,auVar35);
        auVar54 = ZEXT1664(auVar12);
        auVar14 = vfmadd132ps_fma(ZEXT1632(auVar14),auVar34,auVar34);
        auVar56 = ZEXT1664(auVar14);
        puVar29 = local_2608;
        local_2680 = ZEXT1632(auVar12);
        local_2700 = vmulps_avx512vl(local_2680,auVar38);
        auVar59 = ZEXT3264(local_2700);
        local_26a0 = ZEXT1632(auVar13);
        local_2720 = vmulps_avx512vl(local_26a0,auVar39);
        auVar60 = ZEXT3264(local_2720);
        local_26c0 = ZEXT1632(auVar14);
        local_2740 = vmulps_avx512vl(local_26c0,auVar40);
        auVar61 = ZEXT3264(local_2740);
        auVar37 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar35 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1232(ZEXT412(0)) << 0x20);
        bVar30 = (bool)((byte)(uVar32 >> 1) & 1);
        bVar3 = (bool)((byte)(uVar32 >> 2) & 1);
        bVar4 = (bool)((byte)(uVar32 >> 3) & 1);
        bVar5 = (bool)((byte)(uVar32 >> 4) & 1);
        bVar6 = (bool)((byte)(uVar32 >> 5) & 1);
        bVar7 = (bool)((byte)(uVar32 >> 6) & 1);
        bVar8 = SUB81(uVar32 >> 7,0);
        auVar62 = ZEXT3264(CONCAT428((uint)bVar8 * auVar35._28_4_ | (uint)!bVar8 * auVar37._28_4_,
                                     CONCAT424((uint)bVar7 * auVar35._24_4_ |
                                               (uint)!bVar7 * auVar37._24_4_,
                                               CONCAT420((uint)bVar6 * auVar35._20_4_ |
                                                         (uint)!bVar6 * auVar37._20_4_,
                                                         CONCAT416((uint)bVar5 * auVar35._16_4_ |
                                                                   (uint)!bVar5 * auVar37._16_4_,
                                                                   CONCAT412((uint)bVar4 *
                                                                             auVar35._12_4_ |
                                                                             (uint)!bVar4 *
                                                                             auVar37._12_4_,
                                                                             CONCAT48((uint)bVar3 *
                                                                                      auVar35._8_4_
                                                                                      | (uint)!bVar3
                                                                                        * auVar37.
                                                  _8_4_,CONCAT44((uint)bVar30 * auVar35._4_4_ |
                                                                 (uint)!bVar30 * auVar37._4_4_,
                                                                 (uint)(bVar31 & 1) * auVar35._0_4_
                                                                 | (uint)!(bool)(bVar31 & 1) *
                                                                   auVar37._0_4_))))))));
        pauVar27 = (undefined1 (*) [32])local_1e40;
        do {
          pauVar1 = pauVar27 + -1;
          pauVar27 = pauVar27 + -1;
          auVar35 = auVar62._0_32_;
          uVar9 = vcmpps_avx512vl(*pauVar1,auVar35,1);
          auVar37 = *pauVar1;
          if ((char)uVar9 != '\0') {
LAB_0071129e:
            uVar28 = (uint)uVar25;
            if ((uVar25 & 8) == 0) goto code_r0x007112a8;
            if (uVar25 == 0xfffffffffffffff8) break;
            uVar9 = vcmpps_avx512vl(auVar35,auVar37,6);
            if ((char)uVar9 != '\0') {
              uVar32 = (ulong)(uVar28 & 0xf);
              bVar24 = local_27b0;
              if (uVar32 != 8) {
                bVar24 = ~local_27b0;
                uVar26 = 1;
                local_2660 = auVar35;
                do {
                  local_2788.geomID = *(uint *)(((uVar25 & 0xfffffffffffffff0) - 8) + uVar26 * 8);
                  local_2758 = (context->scene->geometries).items[local_2788.geomID].ptr;
                  uVar28 = local_2758->mask;
                  auVar35._4_4_ = uVar28;
                  auVar35._0_4_ = uVar28;
                  auVar35._8_4_ = uVar28;
                  auVar35._12_4_ = uVar28;
                  auVar35._16_4_ = uVar28;
                  auVar35._20_4_ = uVar28;
                  auVar35._24_4_ = uVar28;
                  auVar35._28_4_ = uVar28;
                  uVar9 = vptestmd_avx512vl(auVar35,*(undefined1 (*) [32])(ray + 0x120));
                  bVar22 = (byte)uVar9 & bVar24;
                  if (bVar22 == 0) {
                    bVar22 = 0xff;
                  }
                  else {
                    local_2788.primID = *(uint *)(((uVar25 & 0xfffffffffffffff0) - 4) + uVar26 * 8);
                    local_2640 = vpmovm2d_avx512vl((ulong)bVar22);
                    local_2788.valid = (int *)local_2640;
                    local_2788.geometryUserPtr = local_2758->userPtr;
                    local_2788.context = context->user;
                    local_2788.N = 8;
                    local_2750 = 0;
                    local_2748 = context->args;
                    p_Var21 = local_2748->intersect;
                    if (p_Var21 == (RTCIntersectFunctionN)0x0) {
                      p_Var21 = (RTCIntersectFunctionN)
                                local_2758[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i;
                    }
                    local_2788.rayhit = (RTCRayHitN *)ray;
                    (*p_Var21)(&local_2788);
                    uVar9 = vcmpps_avx512vl(SUB6432(ZEXT1664((undefined1  [16])0x0),0),
                                            *(undefined1 (*) [32])(ray + 0x100),0xe);
                    bVar22 = ~(byte)uVar9;
                    auVar54 = ZEXT3264(local_2680);
                    auVar55 = ZEXT3264(local_26a0);
                    auVar56 = ZEXT3264(local_26c0);
                    auVar57 = ZEXT3264(CONCAT428(0x7f800000,
                                                 CONCAT424(0x7f800000,
                                                           CONCAT420(0x7f800000,
                                                                     CONCAT416(0x7f800000,
                                                                               CONCAT412(0x7f800000,
                                                                                         CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                    auVar58 = ZEXT3264(local_26e0);
                    auVar59 = ZEXT3264(local_2700);
                    auVar60 = ZEXT3264(local_2720);
                    auVar61 = ZEXT3264(local_2740);
                    auVar62 = ZEXT3264(local_2660);
                  }
                  auVar35 = auVar62._0_32_;
                  bVar24 = bVar24 & bVar22;
                } while ((bVar24 != 0) &&
                        (bVar30 = uVar26 < uVar32 - 8, uVar26 = uVar26 + 1, bVar30));
                bVar24 = ~bVar24;
              }
              local_27b0 = local_27b0 | bVar24;
              if (local_27b0 != 0xff) {
                auVar37 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar30 = (bool)(local_27b0 >> 1 & 1);
                bVar3 = (bool)(local_27b0 >> 2 & 1);
                bVar4 = (bool)(local_27b0 >> 3 & 1);
                bVar5 = (bool)(local_27b0 >> 4 & 1);
                bVar6 = (bool)(local_27b0 >> 5 & 1);
                bVar7 = (bool)(local_27b0 >> 6 & 1);
                auVar62 = ZEXT3264(CONCAT428((uint)(local_27b0 >> 7) * auVar37._28_4_ |
                                             (uint)!(bool)(local_27b0 >> 7) * auVar35._28_4_,
                                             CONCAT424((uint)bVar7 * auVar37._24_4_ |
                                                       (uint)!bVar7 * auVar35._24_4_,
                                                       CONCAT420((uint)bVar6 * auVar37._20_4_ |
                                                                 (uint)!bVar6 * auVar35._20_4_,
                                                                 CONCAT416((uint)bVar5 *
                                                                           auVar37._16_4_ |
                                                                           (uint)!bVar5 *
                                                                           auVar35._16_4_,
                                                                           CONCAT412((uint)bVar4 *
                                                                                     auVar37._12_4_
                                                                                     | (uint)!bVar4
                                                                                       * auVar35.
                                                  _12_4_,CONCAT48((uint)bVar3 * auVar37._8_4_ |
                                                                  (uint)!bVar3 * auVar35._8_4_,
                                                                  CONCAT44((uint)bVar30 *
                                                                           auVar37._4_4_ |
                                                                           (uint)!bVar30 *
                                                                           auVar35._4_4_,
                                                                           (uint)(local_27b0 & 1) *
                                                                           auVar37._0_4_ |
                                                                           (uint)!(bool)(local_27b0
                                                                                        & 1) *
                                                                           auVar35._0_4_))))))));
                goto LAB_00711420;
              }
              local_27b0 = 0xff;
              break;
            }
          }
LAB_00711420:
          uVar25 = puVar29[-1];
          puVar29 = puVar29 + -1;
        } while (uVar25 != 0xfffffffffffffff8);
      }
      local_27b0 = local_27b0 & bVar31;
      bVar30 = (bool)(local_27b0 >> 1 & 1);
      bVar3 = (bool)(local_27b0 >> 2 & 1);
      bVar4 = (bool)(local_27b0 >> 3 & 1);
      bVar5 = (bool)(local_27b0 >> 4 & 1);
      bVar6 = (bool)(local_27b0 >> 5 & 1);
      bVar7 = (bool)(local_27b0 >> 6 & 1);
      *(uint *)(ray + 0x100) =
           (uint)(local_27b0 & 1) * -0x800000 |
           (uint)!(bool)(local_27b0 & 1) * *(int *)(ray + 0x100);
      *(uint *)(ray + 0x104) = (uint)bVar30 * -0x800000 | (uint)!bVar30 * *(int *)(ray + 0x104);
      *(uint *)(ray + 0x108) = (uint)bVar3 * -0x800000 | (uint)!bVar3 * *(int *)(ray + 0x108);
      *(uint *)(ray + 0x10c) = (uint)bVar4 * -0x800000 | (uint)!bVar4 * *(int *)(ray + 0x10c);
      *(uint *)(ray + 0x110) = (uint)bVar5 * -0x800000 | (uint)!bVar5 * *(int *)(ray + 0x110);
      *(uint *)(ray + 0x114) = (uint)bVar6 * -0x800000 | (uint)!bVar6 * *(int *)(ray + 0x114);
      *(uint *)(ray + 0x118) = (uint)bVar7 * -0x800000 | (uint)!bVar7 * *(int *)(ray + 0x118);
      *(uint *)(ray + 0x11c) =
           (uint)(local_27b0 >> 7) * -0x800000 |
           (uint)!(bool)(local_27b0 >> 7) * *(int *)(ray + 0x11c);
    }
  }
  return;
code_r0x007112a8:
  uVar32 = uVar25 & 0xfffffffffffffff0;
  lVar23 = -0x10;
  uVar25 = 8;
  auVar36 = auVar57._0_32_;
  do {
    uVar26 = *(ulong *)(uVar32 + 0x20 + lVar23 * 2);
    if (uVar26 == 8) break;
    uVar2 = *(undefined4 *)(uVar32 + 0x90 + lVar23);
    auVar48._4_4_ = uVar2;
    auVar48._0_4_ = uVar2;
    auVar48._8_4_ = uVar2;
    auVar48._12_4_ = uVar2;
    auVar48._16_4_ = uVar2;
    auVar48._20_4_ = uVar2;
    auVar48._24_4_ = uVar2;
    auVar48._28_4_ = uVar2;
    auVar34 = *(undefined1 (*) [32])(ray + 0xe0);
    uVar2 = *(undefined4 *)(uVar32 + 0x30 + lVar23);
    auVar45._4_4_ = uVar2;
    auVar45._0_4_ = uVar2;
    auVar45._8_4_ = uVar2;
    auVar45._12_4_ = uVar2;
    auVar45._16_4_ = uVar2;
    auVar45._20_4_ = uVar2;
    auVar45._24_4_ = uVar2;
    auVar45._28_4_ = uVar2;
    auVar38 = vfmadd213ps_avx512vl(auVar48,auVar34,auVar45);
    uVar2 = *(undefined4 *)(uVar32 + 0xb0 + lVar23);
    auVar49._4_4_ = uVar2;
    auVar49._0_4_ = uVar2;
    auVar49._8_4_ = uVar2;
    auVar49._12_4_ = uVar2;
    auVar49._16_4_ = uVar2;
    auVar49._20_4_ = uVar2;
    auVar49._24_4_ = uVar2;
    auVar49._28_4_ = uVar2;
    uVar2 = *(undefined4 *)(uVar32 + 0x50 + lVar23);
    auVar46._4_4_ = uVar2;
    auVar46._0_4_ = uVar2;
    auVar46._8_4_ = uVar2;
    auVar46._12_4_ = uVar2;
    auVar46._16_4_ = uVar2;
    auVar46._20_4_ = uVar2;
    auVar46._24_4_ = uVar2;
    auVar46._28_4_ = uVar2;
    auVar39 = vfmadd213ps_avx512vl(auVar49,auVar34,auVar46);
    uVar2 = *(undefined4 *)(uVar32 + 0xd0 + lVar23);
    auVar50._4_4_ = uVar2;
    auVar50._0_4_ = uVar2;
    auVar50._8_4_ = uVar2;
    auVar50._12_4_ = uVar2;
    auVar50._16_4_ = uVar2;
    auVar50._20_4_ = uVar2;
    auVar50._24_4_ = uVar2;
    auVar50._28_4_ = uVar2;
    uVar2 = *(undefined4 *)(uVar32 + 0x70 + lVar23);
    auVar15._4_4_ = uVar2;
    auVar15._0_4_ = uVar2;
    auVar15._8_4_ = uVar2;
    auVar15._12_4_ = uVar2;
    auVar15._16_4_ = uVar2;
    auVar15._20_4_ = uVar2;
    auVar15._24_4_ = uVar2;
    auVar15._28_4_ = uVar2;
    auVar40 = vfmadd213ps_avx512vl(auVar50,auVar34,auVar15);
    uVar2 = *(undefined4 *)(uVar32 + 0xa0 + lVar23);
    auVar51._4_4_ = uVar2;
    auVar51._0_4_ = uVar2;
    auVar51._8_4_ = uVar2;
    auVar51._12_4_ = uVar2;
    auVar51._16_4_ = uVar2;
    auVar51._20_4_ = uVar2;
    auVar51._24_4_ = uVar2;
    auVar51._28_4_ = uVar2;
    uVar2 = *(undefined4 *)(uVar32 + 0x40 + lVar23);
    auVar16._4_4_ = uVar2;
    auVar16._0_4_ = uVar2;
    auVar16._8_4_ = uVar2;
    auVar16._12_4_ = uVar2;
    auVar16._16_4_ = uVar2;
    auVar16._20_4_ = uVar2;
    auVar16._24_4_ = uVar2;
    auVar16._28_4_ = uVar2;
    auVar41 = vfmadd213ps_avx512vl(auVar51,auVar34,auVar16);
    uVar2 = *(undefined4 *)(uVar32 + 0xc0 + lVar23);
    auVar52._4_4_ = uVar2;
    auVar52._0_4_ = uVar2;
    auVar52._8_4_ = uVar2;
    auVar52._12_4_ = uVar2;
    auVar52._16_4_ = uVar2;
    auVar52._20_4_ = uVar2;
    auVar52._24_4_ = uVar2;
    auVar52._28_4_ = uVar2;
    uVar2 = *(undefined4 *)(uVar32 + 0x60 + lVar23);
    auVar17._4_4_ = uVar2;
    auVar17._0_4_ = uVar2;
    auVar17._8_4_ = uVar2;
    auVar17._12_4_ = uVar2;
    auVar17._16_4_ = uVar2;
    auVar17._20_4_ = uVar2;
    auVar17._24_4_ = uVar2;
    auVar17._28_4_ = uVar2;
    auVar42 = vfmadd213ps_avx512vl(auVar52,auVar34,auVar17);
    uVar2 = *(undefined4 *)(uVar32 + 0xe0 + lVar23);
    auVar53._4_4_ = uVar2;
    auVar53._0_4_ = uVar2;
    auVar53._8_4_ = uVar2;
    auVar53._12_4_ = uVar2;
    auVar53._16_4_ = uVar2;
    auVar53._20_4_ = uVar2;
    auVar53._24_4_ = uVar2;
    auVar53._28_4_ = uVar2;
    uVar2 = *(undefined4 *)(uVar32 + 0x80 + lVar23);
    auVar18._4_4_ = uVar2;
    auVar18._0_4_ = uVar2;
    auVar18._8_4_ = uVar2;
    auVar18._12_4_ = uVar2;
    auVar18._16_4_ = uVar2;
    auVar18._20_4_ = uVar2;
    auVar18._24_4_ = uVar2;
    auVar18._28_4_ = uVar2;
    auVar43 = vfmadd213ps_avx512vl(auVar53,auVar34,auVar18);
    auVar44 = vfmadd213ps_avx512vl(auVar38,auVar54._0_32_,auVar59._0_32_);
    auVar45 = vfmadd213ps_avx512vl(auVar39,auVar55._0_32_,auVar60._0_32_);
    auVar46 = vfmadd213ps_avx512vl(auVar40,auVar56._0_32_,auVar61._0_32_);
    auVar40 = vfmadd213ps_avx512vl(auVar41,auVar54._0_32_,auVar59._0_32_);
    auVar41 = vfmadd213ps_avx512vl(auVar42,auVar55._0_32_,auVar60._0_32_);
    auVar42 = vfmadd213ps_avx512vl(auVar43,auVar56._0_32_,auVar61._0_32_);
    auVar38 = vpminsd_avx2(auVar44,auVar40);
    auVar39 = vpminsd_avx2(auVar45,auVar41);
    auVar38 = vpmaxsd_avx2(auVar38,auVar39);
    auVar39 = vpminsd_avx2(auVar46,auVar42);
    auVar38 = vpmaxsd_avx2(auVar38,auVar39);
    auVar39 = vpmaxsd_avx2(auVar44,auVar40);
    auVar40 = vpmaxsd_avx2(auVar45,auVar41);
    auVar41 = vpminsd_avx2(auVar39,auVar40);
    auVar39 = vpmaxsd_avx2(auVar46,auVar42);
    auVar40 = vpmaxsd_avx2(auVar38,auVar58._0_32_);
    auVar39 = vpminsd_avx512vl(auVar39,auVar35);
    auVar39 = vpminsd_avx2(auVar41,auVar39);
    uVar33 = vcmpps_avx512vl(auVar40,auVar39,2);
    if ((uVar28 & 7) == 6) {
      uVar2 = *(undefined4 *)(uVar32 + 0xf0 + lVar23);
      auVar19._4_4_ = uVar2;
      auVar19._0_4_ = uVar2;
      auVar19._8_4_ = uVar2;
      auVar19._12_4_ = uVar2;
      auVar19._16_4_ = uVar2;
      auVar19._20_4_ = uVar2;
      auVar19._24_4_ = uVar2;
      auVar19._28_4_ = uVar2;
      uVar10 = vcmpps_avx512vl(auVar34,auVar19,0xd);
      uVar2 = *(undefined4 *)(uVar32 + 0x100 + lVar23);
      auVar20._4_4_ = uVar2;
      auVar20._0_4_ = uVar2;
      auVar20._8_4_ = uVar2;
      auVar20._12_4_ = uVar2;
      auVar20._16_4_ = uVar2;
      auVar20._20_4_ = uVar2;
      auVar20._24_4_ = uVar2;
      auVar20._28_4_ = uVar2;
      uVar11 = vcmpps_avx512vl(auVar34,auVar20,1);
      uVar33 = uVar33 & uVar10 & uVar11;
    }
    uVar10 = vcmpps_avx512vl(auVar35,auVar37,6);
    uVar33 = uVar33 & uVar10;
    uVar10 = uVar25;
    auVar47 = auVar36;
    if ((byte)uVar33 != 0) {
      auVar38 = vblendmps_avx512vl(auVar57._0_32_,auVar38);
      bVar30 = (bool)((byte)uVar33 & 1);
      auVar47._0_4_ = (uint)bVar30 * auVar38._0_4_ | (uint)!bVar30 * auVar34._0_4_;
      bVar30 = (bool)((byte)(uVar33 >> 1) & 1);
      auVar47._4_4_ = (uint)bVar30 * auVar38._4_4_ | (uint)!bVar30 * auVar34._4_4_;
      bVar30 = (bool)((byte)(uVar33 >> 2) & 1);
      auVar47._8_4_ = (uint)bVar30 * auVar38._8_4_ | (uint)!bVar30 * auVar34._8_4_;
      bVar30 = (bool)((byte)(uVar33 >> 3) & 1);
      auVar47._12_4_ = (uint)bVar30 * auVar38._12_4_ | (uint)!bVar30 * auVar34._12_4_;
      bVar30 = (bool)((byte)(uVar33 >> 4) & 1);
      auVar47._16_4_ = (uint)bVar30 * auVar38._16_4_ | (uint)!bVar30 * auVar34._16_4_;
      bVar30 = (bool)((byte)(uVar33 >> 5) & 1);
      auVar47._20_4_ = (uint)bVar30 * auVar38._20_4_ | (uint)!bVar30 * auVar34._20_4_;
      bVar30 = (bool)((byte)(uVar33 >> 6) & 1);
      auVar47._24_4_ = (uint)bVar30 * auVar38._24_4_ | (uint)!bVar30 * auVar34._24_4_;
      bVar30 = SUB81(uVar33 >> 7,0);
      auVar47._28_4_ = (uint)bVar30 * auVar38._28_4_ | (uint)!bVar30 * auVar34._28_4_;
      uVar10 = uVar26;
      if (uVar25 != 8) {
        *puVar29 = uVar25;
        puVar29 = puVar29 + 1;
        *pauVar27 = auVar36;
        pauVar27 = pauVar27 + 1;
      }
    }
    auVar36 = auVar47;
    uVar25 = uVar10;
    lVar23 = lVar23 + 4;
  } while (lVar23 != 0);
  auVar37 = auVar36;
  if (uVar25 == 8) goto LAB_00711420;
  goto LAB_0071129e;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }